

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O3

void sysbvm_function_addFlags
               (sysbvm_context_t *context,sysbvm_tuple_t function,sysbvm_bitflags_t flags)

{
  uint uVar1;
  ulong uVar2;
  
  if ((((function & 0xf) == 0 && function != 0) &&
      (uVar2 = *(ulong *)function, (uVar2 & 0xf) == 0 && uVar2 != 0)) &&
     ((*(byte *)(uVar2 + 8) & 0x80) == 0)) {
    uVar2 = *(ulong *)(uVar2 + 0x70);
    if (uVar2 == 0 || (uVar2 & 0xf) != 0) {
      uVar1 = (uint)((long)uVar2 >> 4);
    }
    else {
      uVar1 = (uint)*(undefined8 *)(uVar2 + 0x10);
    }
    if ((uVar1 >> 0xc & 1) != 0) {
      uVar2 = *(ulong *)(function + 0x28);
      if (uVar2 == 0 || (uVar2 & 0xf) != 0) {
        uVar2 = (long)uVar2 >> 4;
      }
      else {
        uVar2 = *(ulong *)(uVar2 + 0x10);
      }
      *(ulong *)(function + 0x28) = (uVar2 | flags) << 4 | 0xb;
      return;
    }
  }
  sysbvm_error("Expected a function.");
}

Assistant:

SYSBVM_API void sysbvm_function_addFlags(sysbvm_context_t *context, sysbvm_tuple_t function, sysbvm_bitflags_t flags)
{
    if(!sysbvm_tuple_isFunction(context, function))
        sysbvm_error("Expected a function.");

    sysbvm_function_t *functionObject = (sysbvm_function_t*)function;
    functionObject->flags = sysbvm_tuple_bitflags_encode(sysbvm_tuple_bitflags_decode(functionObject->flags) | flags);
}